

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O0

bool __thiscall QAlphaPaintEngine::end(QAlphaPaintEngine *this)

{
  QAlphaPaintEnginePrivate *pQVar1;
  QAlphaPaintEnginePrivate *d;
  bool in_stack_0000009f;
  QAlphaPaintEngine *in_stack_000000a0;
  
  pQVar1 = d_func((QAlphaPaintEngine *)0x1296ec);
  pQVar1->m_continueCall = true;
  if (pQVar1->m_pass == 0) {
    flushAndInit(in_stack_000000a0,in_stack_0000009f);
  }
  return true;
}

Assistant:

bool QAlphaPaintEngine::end()
{
    Q_D(QAlphaPaintEngine);

    d->m_continueCall = true;
    if (d->m_pass != 0) {
        return true;
    }

    flushAndInit(false);
    return true;
}